

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit.cc
# Opt level: O2

void ProcessByCount(void)

{
  ostream *poVar1;
  long in_FS_OFFSET;
  undefined **local_20;
  int local_18;
  undefined8 local_10;
  undefined ***local_8;
  
  local_8 = &local_20;
  local_20 = &PTR__LimitCount_00104d80;
  local_18 = 500;
  local_10 = *(undefined8 *)(in_FS_OFFSET + -8);
  *(undefined ****)(in_FS_OFFSET + -8) = local_8;
  ResourceConsumingWorker();
  poVar1 = std::operator<<((ostream *)&std::cerr,"Resources remaining: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  std::endl<char,std::char_traits<char>>(poVar1);
  *(undefined8 *)(in_FS_OFFSET + -8) = local_10;
  return;
}

Assistant:

void ProcessByCount() {
  LimitCount limit(500);
  ResourceConsumingWorker();
  std::cerr << "Resources remaining: " << limit.ResourcesRemaining()
            << std::endl;
}